

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O0

void __thiscall cmGlobalNinjaGenerator::OpenBuildFileStream(cmGlobalNinjaGenerator *this)

{
  cmake *this_00;
  char *pcVar1;
  cmGeneratedFileStream *this_01;
  ostream *poVar2;
  allocator local_31;
  string local_30 [8];
  string buildFilePath;
  cmGlobalNinjaGenerator *this_local;
  
  buildFilePath.field_2._8_8_ = this;
  this_00 = cmGlobalGenerator::GetCMakeInstance(&this->super_cmGlobalGenerator);
  pcVar1 = cmake::GetHomeOutputDirectory(this_00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,pcVar1,&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  std::__cxx11::string::operator+=(local_30,"/");
  std::__cxx11::string::operator+=(local_30,NINJA_BUILD_FILE);
  if (this->BuildFileStream == (cmGeneratedFileStream *)0x0) {
    this_01 = (cmGeneratedFileStream *)operator_new(0x248);
    pcVar1 = (char *)std::__cxx11::string::c_str();
    cmGeneratedFileStream::cmGeneratedFileStream(this_01,pcVar1,false);
    this->BuildFileStream = this_01;
    if (this->BuildFileStream == (cmGeneratedFileStream *)0x0) goto LAB_006e3620;
  }
  WriteDisclaimer(this,(ostream *)this->BuildFileStream);
  poVar2 = std::operator<<((ostream *)this->BuildFileStream,
                           "# This file contains all the build statements describing the\n");
  std::operator<<(poVar2,"# compilation DAG.\n\n");
LAB_006e3620:
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void cmGlobalNinjaGenerator::OpenBuildFileStream()
{
  // Compute Ninja's build file path.
  std::string buildFilePath =
    this->GetCMakeInstance()->GetHomeOutputDirectory();
  buildFilePath += "/";
  buildFilePath += cmGlobalNinjaGenerator::NINJA_BUILD_FILE;

  // Get a stream where to generate things.
  if (!this->BuildFileStream)
    {
    this->BuildFileStream = new cmGeneratedFileStream(buildFilePath.c_str());
    if (!this->BuildFileStream)
      {
      // An error message is generated by the constructor if it cannot
      // open the file.
      return;
      }
    }

  // Write the do not edit header.
  this->WriteDisclaimer(*this->BuildFileStream);

  // Write a comment about this file.
  *this->BuildFileStream
    << "# This file contains all the build statements describing the\n"
    << "# compilation DAG.\n\n"
    ;
}